

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_is_equal(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  operand local_e4;
  operation local_e0 [4];
  undefined1 local_d0 [8];
  string lab;
  string lab_eq;
  operation local_88;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  local_7c[0] = MOV;
  local_84[1] = 9;
  local_84[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_7c,local_84 + 1,local_84);
  local_88 = MOV;
  lab_eq.field_2._12_4_ = 0x14;
  lab_eq.field_2._8_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,(operand *)(lab_eq.field_2._M_local_buf + 0xc),
             (operand *)(lab_eq.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&lab.field_2 + 8),psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_d0,psVar1,lab_02);
  local_e0[3] = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e0 + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  compile_recursively_equal
            (code,(compiler_options *)error.field_2._8_8_,(string *)((long)&lab.field_2 + 8));
  local_e0[2] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e0 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  local_e0[1] = 3;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&lab.field_2 + 8));
  local_e0[0] = JMP;
  local_e4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_e0,&local_e4);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_isequal_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(lab.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_is_equal(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
  std::string lab_eq = label_to_string(label++);
  std::string lab = label_to_string(label++);
  code.add(asmcode::JMP, lab);
  compile_recursively_equal(code, ops, lab_eq);
  code.add(asmcode::LABEL, lab);
  code.add(asmcode::CALL, lab_eq);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_isequal_contract_violation);
    }
  }